

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scurve.c
# Opt level: O2

int SCurveSpdCtrl_Calc(SCurveSpdCtrl_t *pSCurveSpdCtrl)

{
  float fVar1;
  float fVar2;
  
  if (pSCurveSpdCtrl->Flag == '\0') {
    return 0;
  }
  fVar1 = pSCurveSpdCtrl->TargetSpd;
  fVar2 = pSCurveSpdCtrl->Spd;
  if (-0.01 <= fVar2 - fVar1) {
    if ((fVar2 - fVar1 <= 0.01) ||
       (fVar2 = fVar2 - pSCurveSpdCtrl->Dec * pSCurveSpdCtrl->TimeInc, fVar2 < fVar1)) {
      return 1;
    }
  }
  else {
    fVar2 = pSCurveSpdCtrl->Acc * pSCurveSpdCtrl->TimeInc + fVar2;
    if (fVar1 < fVar2) {
      return 1;
    }
  }
  pSCurveSpdCtrl->Spd = fVar2;
  pSCurveSpdCtrl->SpdOutput = fVar2;
  return 2;
}

Assistant:

int SCurveSpdCtrl_Calc(SCurveSpdCtrl_t *pSCurveSpdCtrl)
{
	if (pSCurveSpdCtrl->Flag == 0)
		return 0;

	if (pSCurveSpdCtrl->Spd - pSCurveSpdCtrl->TargetSpd < -0.01f)
	{
		if (pSCurveSpdCtrl->Spd + pSCurveSpdCtrl->Acc * pSCurveSpdCtrl->TimeInc <= pSCurveSpdCtrl->TargetSpd)
			pSCurveSpdCtrl->Spd += pSCurveSpdCtrl->Acc * pSCurveSpdCtrl->TimeInc;
		else
			return 1;
		pSCurveSpdCtrl->SpdOutput = pSCurveSpdCtrl->Spd;
	}
	else if (pSCurveSpdCtrl->Spd - pSCurveSpdCtrl->TargetSpd > 0.01f)
	{
		if (pSCurveSpdCtrl->Spd - pSCurveSpdCtrl->Dec * pSCurveSpdCtrl->TimeInc >= pSCurveSpdCtrl->TargetSpd)
			pSCurveSpdCtrl->Spd -= pSCurveSpdCtrl->Dec * pSCurveSpdCtrl->TimeInc;
		else
			return 1;
		pSCurveSpdCtrl->SpdOutput = pSCurveSpdCtrl->Spd;
	}
	else
	{
		return 1;
	}

	return 2;
}